

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O3

bool __thiscall
aeron::archive::ArchiveProxy::findLastMatchingRecording
          (ArchiveProxy *this,int64_t minRecordingId,string *channelFragment,int32_t streamId,
          int32_t sessionId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  FindLastMatchingRecordingRequest *this_00;
  int32_t val_2;
  int64_t val;
  int32_t val_3;
  int64_t val_1;
  FindLastMatchingRecordingRequest msg;
  FindLastMatchingRecordingRequest local_68;
  
  local_68.m_offset = 0;
  local_68.m_buffer = (char *)0x0;
  local_68.m_bufferLength = 0;
  this_00 = wrapAndApplyHeader<io::aeron::archive::codecs::FindLastMatchingRecordingRequest>
                      (this,&local_68);
  *(int64_t *)(this_00->m_buffer + this_00->m_offset) = controlSessionId;
  *(int64_t *)(this_00->m_buffer + this_00->m_offset + 8) = correlationId;
  *(int64_t *)(this_00->m_buffer + this_00->m_offset + 0x10) = minRecordingId;
  *(int32_t *)(this_00->m_buffer + this_00->m_offset + 0x18) = sessionId;
  *(int32_t *)(this_00->m_buffer + this_00->m_offset + 0x1c) = streamId;
  io::aeron::archive::codecs::FindLastMatchingRecordingRequest::putChannel(this_00,channelFragment);
  bVar1 = offer(this,(int)local_68.m_position - (int)local_68.m_offset);
  return bVar1;
}

Assistant:

bool ArchiveProxy::findLastMatchingRecording(std::int64_t minRecordingId, const std::string& channelFragment, std::int32_t streamId,
                                   std::int32_t sessionId, std::int64_t correlationId, std::int64_t controlSessionId)
{
    codecs::FindLastMatchingRecordingRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .minRecordingId(minRecordingId)
        .sessionId(sessionId)
        .streamId(streamId)
        .putChannel(channelFragment);

    return offer(msg.encodedLength());
}